

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeuleranalysis.cpp
# Opt level: O0

void __thiscall
TPZEulerAnalysis::UpdateSolAndRhs<double>
          (TPZEulerAnalysis *this,TPZFMatrix<double> *deltaSol,REAL *epsilon)

{
  TPZCompMesh *this_00;
  double *in_RDX;
  TPZMatrix<double> *in_RDI;
  TPZSolutionMatrix *this_01;
  STATE SVar1;
  TPZFMatrix<double> *unaff_retaddr;
  int outofrange;
  REAL initEpsilon;
  TPZFMatrix<double> *sol;
  TPZFMatrix<double> *in_stack_000004e0;
  TPZFMatrix<double> *in_stack_000004e8;
  REAL *in_stack_000004f0;
  TPZEulerAnalysis *in_stack_000004f8;
  TPZSolutionMatrix *in_stack_ffffffffffffffa8;
  TPZSolutionMatrix *in_stack_ffffffffffffffb0;
  TPZSolutionMatrix *mat;
  TPZMatrix<double> *aBase;
  
  aBase = in_RDI;
  this_00 = (TPZCompMesh *)
            TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_ffffffffffffffb0);
  mat = (TPZSolutionMatrix *)*in_RDX;
  TPZFMatrix<double>::operator+=(unaff_retaddr,aBase);
  TPZCompMesh::LoadSolution(this_00,mat);
  (*(in_RDI->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])();
  this_01 = (TPZSolutionMatrix *)::Norm(in_stack_ffffffffffffffa8);
  *in_RDX = (double)this_01;
  if ((double)mat < *in_RDX) {
    TPZFMatrix<double>::operator-=(unaff_retaddr,aBase);
    TPZCompMesh::LoadSolution(this_00,mat);
    TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(this_01);
    LineSearch(in_stack_000004f8,in_stack_000004f0,in_stack_000004e8,in_stack_000004e0);
    TPZFMatrix<double>::operator+=(unaff_retaddr,aBase);
    TPZCompMesh::LoadSolution(this_00,mat);
    SVar1 = ::Norm(in_stack_ffffffffffffffa8);
    *in_RDX = SVar1;
  }
  return;
}

Assistant:

void TPZEulerAnalysis::UpdateSolAndRhs(TPZFMatrix<TVar> & deltaSol, REAL & epsilon)
{
	TPZFMatrix<TVar> &sol = fSolution;
    REAL initEpsilon = epsilon;
    int outofrange = 0;
    try
    {
        sol += deltaSol;
        fCompMesh->LoadSolution(fSolution);
        AssembleRhs();
        epsilon = Norm(fRhs);
    }
	catch(...)
	{
		outofrange = 1;
		sol -= deltaSol;
		epsilon = initEpsilon;
		fCompMesh->LoadSolution(fSolution);
	}
	
    if(epsilon > initEpsilon)
    {
		sol -= deltaSol;
		fCompMesh->LoadSolution(fSolution);
		/*int resultlin = */
		LineSearch(initEpsilon ,fSolution, deltaSol);
		sol += deltaSol;
		fCompMesh->LoadSolution(fSolution);
		epsilon = Norm(fRhs);
    }
	
    if(outofrange)
    {
		/*int resultlin = */LineSearch(initEpsilon ,fSolution, deltaSol);
		sol += deltaSol;
		fCompMesh->LoadSolution(fSolution);
		epsilon = Norm(fRhs);
		fFlowCompMesh->ScaleCFL(.5);
    }
}